

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  byte *pbVar3;
  uint *puVar4;
  nullres nVar5;
  bool bVar6;
  FILE *pFVar7;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  FILE *pFVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  char **ppcVar24;
  char **fileName;
  uint i;
  int iVar25;
  uint *bytecode;
  char *local_1460;
  char **local_1458;
  uint local_144c;
  char *local_1448;
  ulong local_1440;
  char tmp [256];
  char cmdLine [4096];
  
  nullcInit();
  nullcAddImportPath("Modules/");
  local_1460 = (char *)CONCAT44(local_1460._4_4_,argc);
  if (argc == 1) {
    puts("usage: nullcl [-o output.ncm] file.nc [-m module.name] [file2.nc [-m module.name] ...]");
    puts("usage: nullcl -c [-i import_folder] output.cpp file.nc");
    puts("usage: nullcl -x [-i import_folder] output.exe file.nc");
    return 1;
  }
  pbVar3 = (byte *)argv[1];
  uVar22 = *pbVar3 - 0x2d;
  if ((uVar22 == 0) && (uVar22 = pbVar3[1] - 0x76, uVar22 == 0)) {
    uVar22 = (uint)pbVar3[2];
  }
  uVar20 = (uint)(uVar22 == 0);
  uVar8 = (ulong)(uVar20 + 1);
  pbVar3 = (byte *)argv[uVar8];
  bVar2 = *pbVar3;
  iVar25 = -(bVar2 - 0x2d);
  iVar21 = iVar25;
  local_1458 = argv;
  if (bVar2 == 0x2d) {
    uVar19 = pbVar3[1] - 0x6f;
    if (uVar19 == 0) {
      uVar19 = (uint)pbVar3[2];
    }
    if (uVar19 != 0) {
      uVar20 = pbVar3[1] - 99;
      if (uVar20 == 0) {
        uVar20 = (uint)pbVar3[2];
      }
      iVar21 = -uVar20;
      goto LAB_00109b9e;
    }
    uVar22 = uVar20 + 2;
    if (uVar22 != argc) {
      pFVar12 = fopen(argv[uVar22],"wb");
      if (pFVar12 != (FILE *)0x0) {
        uVar8 = (ulong)(uVar20 + 3);
        uVar23 = uVar8;
        goto LAB_00109bcb;
      }
      pcVar18 = argv[uVar22];
      pcVar9 = "Cannot create output file %s\n";
LAB_0010a2ae:
      printf(pcVar9,pcVar18);
      goto LAB_00109f26;
    }
    pcVar9 = "Output file name not found after -o";
  }
  else {
LAB_00109b9e:
    if (iVar21 != 0) {
      iVar21 = iVar25;
      if (bVar2 == 0x2d) {
        uVar20 = pbVar3[1] - 0x78;
        if (uVar20 == 0) {
          uVar20 = (uint)pbVar3[2];
        }
        iVar21 = -uVar20;
      }
      if (iVar21 != 0) {
        pFVar12 = (FILE *)0x0;
        uVar23 = uVar8;
LAB_00109bcb:
        do {
          iVar21 = (int)uVar8;
          if ((int)(uint)local_1460 <= iVar21) {
LAB_0010a31f:
            uVar22 = (uint)uVar8;
LAB_0010a322:
            if ((uint)uVar23 == uVar22) {
              puts("None of the input files were found");
            }
            if (pFVar12 != (FILE *)0x0) {
              fclose(pFVar12);
            }
            nullcTerminate();
            return (uint)(uVar22 != (uint)local_1460);
          }
          local_144c = iVar21 + 1;
          pcVar9 = argv[iVar21];
          local_1440 = uVar8;
          pFVar7 = fopen(pcVar9,"rb");
          if (pFVar7 == (FILE *)0x0) {
            printf("Cannot open file %s\n",pcVar9);
            uVar22 = local_144c;
            goto LAB_0010a322;
          }
          iVar21 = (uint)local_1460;
          local_1448 = pcVar9;
          fseek(pFVar7,0,2);
          uVar8 = ftell(pFVar7);
          fseek(pFVar7,0,0);
          pcVar9 = (char *)operator_new__((ulong)((int)uVar8 + 1));
          fread(pcVar9,1,uVar8 & 0xffffffff,pFVar7);
          pcVar9[uVar8 & 0xffffffff] = '\0';
          fclose(pFVar7);
          nVar5 = nullcCompile(pcVar9);
          if (nVar5 == '\0') {
            pcVar18 = nullcGetLastError();
            printf("Compilation of %s failed with error:\n%s\n",local_1448,pcVar18);
            operator_delete__(pcVar9);
            goto LAB_00109f26;
          }
          bytecode = (uint *)0x0;
          nullcGetBytecode((char **)&bytecode);
          operator_delete__(pcVar9);
          pcVar9 = local_1448;
          uVar22 = local_144c;
          if (iVar21 <= (int)local_144c) {
LAB_00109cd4:
            sVar10 = strlen(local_1448);
            if (0xfffffffffffffbff < sVar10 - 0x3ff) {
              strcpy(cmdLine,pcVar9);
              pcVar11 = strchr(cmdLine,0x2e);
              pcVar18 = cmdLine;
              if (pcVar11 != (char *)0x0) {
                *pcVar11 = '\0';
              }
LAB_00109d0f:
              if (*pcVar18 != '\0') {
                if (*pcVar18 != '\\') goto LAB_00109d22;
                pcVar11 = pcVar18 + 1;
                goto LAB_00109d2f;
              }
              goto LAB_00109d3b;
            }
            pcVar9 = "File name is too long";
LAB_0010a256:
            puts(pcVar9);
            if (bytecode != (uint *)0x0) {
              operator_delete__(bytecode);
            }
            uVar8 = (ulong)uVar22;
            goto LAB_0010a31f;
          }
          pbVar3 = (byte *)local_1458[(int)local_144c];
          uVar20 = *pbVar3 - 0x2d;
          if ((uVar20 == 0) && (uVar20 = pbVar3[1] - 0x6d, uVar20 == 0)) {
            uVar20 = (uint)pbVar3[2];
          }
          if (uVar20 != 0) goto LAB_00109cd4;
          uVar22 = (int)local_1440 + 2;
          if (uVar22 == (uint)local_1460) {
            puts("Module name not found after -m");
            uVar8 = (ulong)local_1460 & 0xffffffff;
            if (bytecode != (uint *)0x0) {
              operator_delete__(bytecode);
              uVar8 = (ulong)local_1460 & 0xffffffff;
            }
            goto LAB_0010a31f;
          }
          pcVar18 = local_1458[(int)uVar22];
          sVar10 = strlen(pcVar18);
          if (sVar10 - 0x3ff < 0xfffffffffffffc00) {
            pcVar9 = "Module name is too long";
            goto LAB_0010a256;
          }
          strcpy(cmdLine,pcVar18);
          uVar22 = (int)local_1440 + 3;
LAB_00109d3b:
          uVar8 = (ulong)uVar22;
          nullcLoadModuleByBinary(cmdLine,(char *)bytecode);
          if (pFVar12 == (FILE *)0x0) {
            sVar10 = strlen(pcVar9);
            if (sVar10 - 0x3fe < 0xfffffffffffffc01) {
              puts("File name is too long");
            }
            else {
              strcpy(tmp,pcVar9);
              sVar10 = strlen(tmp);
              (tmp + sVar10)[0] = 'm';
              (tmp + sVar10)[1] = '\0';
              pFVar7 = fopen(tmp,"wb");
              if (pFVar7 != (FILE *)0x0) {
                sVar10 = strlen(cmdLine);
                fwrite(cmdLine,1,sVar10 + 1,pFVar7);
                fwrite(bytecode,1,(ulong)*bytecode,pFVar7);
                fclose(pFVar7);
                goto LAB_00109e0f;
              }
              printf("Cannot create output file %s\n",tmp);
            }
            if (bytecode != (uint *)0x0) {
              operator_delete__(bytecode);
            }
            goto LAB_0010a31f;
          }
          sVar10 = strlen(cmdLine);
          fwrite(cmdLine,1,sVar10 + 1,pFVar12);
          fwrite(bytecode,1,(ulong)*bytecode,pFVar12);
LAB_00109e0f:
          argv = local_1458;
          if (bytecode != (uint *)0x0) {
            operator_delete__(bytecode);
            argv = local_1458;
          }
        } while( true );
      }
    }
    if (bVar2 == 0x2d) {
      uVar20 = pbVar3[1] - 0x78;
      if (uVar20 == 0) {
        uVar20 = (uint)pbVar3[2];
      }
      iVar25 = -uVar20;
    }
    for (; (long)(uVar8 + 1) < (long)argc; uVar8 = uVar8 + 2) {
      pbVar3 = (byte *)local_1458[uVar8 + 1];
      uVar20 = *pbVar3 - 0x2d;
      if ((uVar20 == 0) && (uVar20 = pbVar3[1] - 0x69, uVar20 == 0)) {
        uVar20 = (uint)pbVar3[2];
      }
      if (uVar20 != 0) break;
      if ((ulong)(uint)argc - 2 == uVar8) {
        pcVar9 = "Missing folder name after -i";
        goto LAB_00109f21;
      }
      nullcAddImportPath(local_1458[uVar8 + 2]);
    }
    if ((int)uVar8 - (uint)local_1460 == -1) {
      pcVar9 = "Output file name not found after options";
    }
    else {
      if ((int)uVar8 - (uint)local_1460 != -2) {
        pcVar9 = local_1458[uVar8 + 1];
        pcVar18 = local_1458[uVar8 + 2];
        pFVar12 = fopen(pcVar18,"rb");
        if (pFVar12 != (FILE *)0x0) {
          local_1458 = (char **)pcVar9;
          fseek(pFVar12,0,2);
          uVar8 = ftell(pFVar12);
          fseek(pFVar12,0,0);
          pcVar9 = (char *)operator_new__((ulong)((int)uVar8 + 1));
          fread(pcVar9,1,uVar8 & 0xffffffff,pFVar12);
          pcVar9[uVar8 & 0xffffffff] = '\0';
          fclose(pFVar12);
          nVar5 = nullcCompile(pcVar9);
          ppcVar24 = local_1458;
          if (nVar5 != '\0') {
            fileName = (char **)"__temp.cpp";
            if (iVar25 != 0) {
              fileName = local_1458;
            }
            nVar5 = nullcTranslateToC((char *)fileName,"main",AddDependency);
            if (nVar5 != '\0') {
              if (iVar25 == 0) {
                builtin_strncpy(cmdLine,"gcc -g -o ",0xb);
                local_1460 = pcVar9;
                sVar10 = strlen(cmdLine);
                pcVar9 = cmdLine + sVar10;
                strcpy(pcVar9,(char *)ppcVar24);
                sVar13 = strlen(pcVar9);
                pcVar9 = pcVar9 + sVar13;
                builtin_strncpy(cmdLine + sVar13 + sVar10," __temp.cpp",0xc);
                sVar14 = strlen(pcVar9);
                pcVar9 = pcVar9 + sVar14;
                builtin_strncpy(cmdLine + sVar14 + sVar13 + sVar10," -Itranslation",0xf);
                sVar15 = strlen(pcVar9);
                pcVar9 = pcVar9 + sVar15;
                builtin_strncpy(cmdLine + sVar15 + sVar14 + sVar13 + sVar10," -INULLC/translation",
                                0x15);
                sVar16 = strlen(pcVar9);
                pcVar9 = pcVar9 + sVar16;
                builtin_strncpy(cmdLine + sVar16 + sVar15 + sVar14 + sVar13 + sVar10,
                                " -I../NULLC/translation",0x18);
                sVar17 = strlen(pcVar9);
                builtin_strncpy(cmdLine + sVar17 + sVar16 + sVar15 + sVar14 + sVar13 + sVar10," -O2"
                                ,5);
                sVar10 = strlen(pcVar9 + sVar17);
                bytecode = (uint *)(pcVar9 + sVar17 + sVar10);
                bVar6 = SearchAndAddSourceFile((char **)&bytecode,"runtime.cpp");
                if (!bVar6) {
                  puts("Failed to find \'runtime.cpp\' input file");
                }
                ppcVar24 = translationDependencies;
                for (uVar8 = 0; puVar4 = bytecode, uVar8 < translationDependencyCount;
                    uVar8 = uVar8 + 1) {
                  pcVar18 = *ppcVar24;
                  pcVar9 = (char *)((long)bytecode + 1);
                  *(undefined1 *)bytecode = 0x20;
                  strcpy(pcVar9,pcVar18);
                  sVar10 = strlen(pcVar9);
                  bytecode = (uint *)((long)puVar4 + sVar10 + 1);
                  pcVar9 = strstr(pcVar18,"import_");
                  if (pcVar9 != (char *)0x0) {
                    format(tmp,0x100,"%s",pcVar18 + 7);
                    pcVar9 = strstr(tmp,"_nc.cpp");
                    if (pcVar9 != (char *)0x0) {
                      builtin_strncpy(pcVar9,"_bind.cpp",10);
                    }
                    bVar6 = SearchAndAddSourceFile((char **)&bytecode,tmp);
                    if (!bVar6) {
                      printf("Failed to find \'%s\' input file\n",tmp);
                    }
                  }
                  ppcVar24 = ppcVar24 + 1;
                }
                *(undefined8 *)((long)bytecode + 6) = 0x6d6c2d202b2b63;
                bytecode[0] = 0x736c2d20;
                bytecode[1] = 0x2b636474;
                if (uVar22 == 0) {
                  printf("Command line: %s\n",cmdLine);
                }
                system(cmdLine);
                pcVar9 = local_1460;
              }
              operator_delete__(pcVar9);
              nullcTerminate();
              return 0;
            }
          }
          pcVar11 = nullcGetLastError();
          printf("Compilation of %s failed with error:\n%s\n",pcVar18,pcVar11);
          operator_delete__(pcVar9);
          return 1;
        }
        pcVar9 = "Cannot open file %s\n";
        goto LAB_0010a2ae;
      }
      pcVar9 = "Input file name not found after output file name";
    }
  }
LAB_00109f21:
  puts(pcVar9);
LAB_00109f26:
  nullcTerminate();
  return 1;
LAB_00109d22:
  pcVar11 = pcVar18 + 2;
  pcVar1 = pcVar18 + 1;
  pcVar18 = pcVar11;
  if (*pcVar1 == '/') {
LAB_00109d2f:
    pcVar11[-1] = '.';
    pcVar18 = pcVar11;
  }
  goto LAB_00109d0f;
}

Assistant:

int main(int argc, char** argv)
{
	nullcInit();
	nullcAddImportPath("Modules/");

	if(argc == 1)
	{
		printf("usage: nullcl [-o output.ncm] file.nc [-m module.name] [file2.nc [-m module.name] ...]\n");
		printf("usage: nullcl -c [-i import_folder] output.cpp file.nc\n");
		printf("usage: nullcl -x [-i import_folder] output.exe file.nc\n");
		return 1;
	}

	int argIndex = 1;
	FILE *mergeFile = NULL;
	bool verbose = false;

	if(strcmp("-v", argv[argIndex]) == 0)
	{
		argIndex++;

		verbose = true;
	}

	if(strcmp("-o", argv[argIndex]) == 0)
	{
		argIndex++;
		if(argIndex == argc)
		{
			printf("Output file name not found after -o\n");
			nullcTerminate();
			return 1;
		}
		mergeFile = fopen(argv[argIndex], "wb");
		if(!mergeFile)
		{
			printf("Cannot create output file %s\n", argv[argIndex]);
			nullcTerminate();
			return 1;
		}
		argIndex++;
	}else if(strcmp("-c", argv[argIndex]) == 0 || strcmp("-x", argv[argIndex]) == 0){
		bool link = strcmp("-x", argv[argIndex]) == 0;
		argIndex++;

		while(argIndex < argc && strcmp("-i", argv[argIndex]) == 0)
		{
			argIndex++;

			if(argIndex == argc)
			{
				printf("Missing folder name after -i\n");
				nullcTerminate();
				return 1;
			}

			const char* folder = argv[argIndex++];
			nullcAddImportPath(folder);
		}

		if(argIndex == argc)
		{
			printf("Output file name not found after options\n");
			nullcTerminate();
			return 1;
		}

		const char *outputName = argv[argIndex++];

		if(argIndex == argc)
		{
			printf("Input file name not found after output file name\n");
			nullcTerminate();
			return 1;
		}

		const char *fileName = argv[argIndex++];
		FILE *ncFile = fopen(fileName, "rb");
		if(!ncFile)
		{
			printf("Cannot open file %s\n", fileName);
			nullcTerminate();
			return 1;
		}

		fseek(ncFile, 0, SEEK_END);
		unsigned int textSize = ftell(ncFile);
		fseek(ncFile, 0, SEEK_SET);
		char *fileContent = new char[textSize+1];
		fread(fileContent, 1, textSize, ncFile);
		fileContent[textSize] = 0;
		fclose(ncFile);

		if(!nullcCompile(fileContent))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			return 1;
		}

		if(!nullcTranslateToC(link ? "__temp.cpp" : outputName, "main", AddDependency))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			return 1;
		}

		if(link)
		{
			// $$$ move this to a dependency file?
			char cmdLine[4096];

			char *pos = cmdLine;
			strcpy(pos, "gcc -g -o ");
			pos += strlen(pos);

			strcpy(pos, outputName);
			pos += strlen(pos);

			strcpy(pos, " __temp.cpp");
			pos += strlen(pos);

			strcpy(pos, " -Itranslation");
			pos += strlen(pos);

			strcpy(pos, " -INULLC/translation");
			pos += strlen(pos);

			strcpy(pos, " -I../NULLC/translation");
			pos += strlen(pos);

			strcpy(pos, " -O2");
			pos += strlen(pos);

			if(!SearchAndAddSourceFile(pos, "runtime.cpp"))
				printf("Failed to find 'runtime.cpp' input file\n");

			for(unsigned i = 0; i < translationDependencyCount; i++)
			{
				const char *dependency = translationDependencies[i];

				*(pos++) = ' ';

				strcpy(pos, dependency);
				pos += strlen(pos);

				if(strstr(dependency, "import_"))
				{
					char tmp[256];
					format(tmp, 256, "%s", dependency + strlen("import_"));

					if(char *pos = strstr(tmp, "_nc.cpp"))
						strcpy(pos, "_bind.cpp");

					if(!SearchAndAddSourceFile(pos, tmp))
						printf("Failed to find '%s' input file\n", tmp);
				}
			}

			strcpy(pos, " -lstdc++ -lm");
			pos += strlen(pos);

			if (verbose)
				printf("Command line: %s\n", cmdLine);

			system(cmdLine);
		}
		delete[] fileContent;
		nullcTerminate();
		return 0;
	}
	int currIndex = argIndex;
	while(argIndex < argc)
	{
		const char *fileName = argv[argIndex++];

		FILE *ncFile = fopen(fileName, "rb");
		if(!ncFile)
		{
			printf("Cannot open file %s\n", fileName);
			break;
		}

		fseek(ncFile, 0, SEEK_END);
		unsigned int textSize = ftell(ncFile);
		fseek(ncFile, 0, SEEK_SET);
		char *fileContent = new char[textSize+1];
		fread(fileContent, 1, textSize, ncFile);
		fileContent[textSize] = 0;
		fclose(ncFile);

		if(!nullcCompile(fileContent))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			nullcTerminate();
			return 1;
		}
		unsigned int *bytecode = NULL;
		nullcGetBytecode((char**)&bytecode);
		delete[] fileContent;

		// Create module name
		char	moduleName[1024];
		if(argIndex < argc && strcmp("-m", argv[argIndex]) == 0)
		{
			argIndex++;
			if(argIndex == argc)
			{
				printf("Module name not found after -m\n");

				delete[] bytecode;
				break;
			}

			if(strlen(argv[argIndex]) + 1 >= 1024)
			{
				printf("Module name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(moduleName, argv[argIndex]);

			argIndex++;
		}
		else
		{
			if(strlen(fileName) + 1 >= 1024)
			{
				printf("File name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(moduleName, fileName);
			if(char *extensionPos = strchr(moduleName, '.'))
				*extensionPos = '\0';
			char	*pos = moduleName;
			while(*pos)
			{
				if(*pos++ == '\\' || *pos++ == '/')
					pos[-1] = '.';
			}
		}
		nullcLoadModuleByBinary(moduleName, (const char*)bytecode);

		if(!mergeFile)
		{
			char newName[1024];

			// Ont extra character for 'm' appended at the end
			if(strlen(fileName) + 1 >= 1024 - 1)
			{
				printf("File name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(newName, fileName);
			strcat(newName, "m");
			FILE *nmcFile = fopen(newName, "wb");
			if(!nmcFile)
			{
				printf("Cannot create output file %s\n", newName);

				delete[] bytecode;
				break;
			}
			fwrite(moduleName, 1, strlen(moduleName) + 1, nmcFile);
			fwrite(bytecode, 1, *bytecode, nmcFile);
			fclose(nmcFile);
		}else{
			fwrite(moduleName, 1, strlen(moduleName) + 1, mergeFile);
			fwrite(bytecode, 1, *bytecode, mergeFile);
		}

		delete[] bytecode;
	}
	if(currIndex == argIndex)
		printf("None of the input files were found\n");

	if(mergeFile)
		fclose(mergeFile);

	nullcTerminate();

	return argIndex != argc;	
}